

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void absl::lts_20240722::AppendCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  byte bVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined8 uVar4;
  ulong uVar5;
  Nonnull<char_*> dst_00;
  ulong uVar6;
  
  sVar3 = dst->_M_string_length;
  uVar6 = (ulong)(src->contents_).data_.rep_.field_0.data[0];
  if ((uVar6 & 1) == 0) {
    uVar6 = uVar6 >> 1;
  }
  else {
    uVar6 = ((src->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>(dst,uVar6 + sVar3);
  dst_00 = (dst->_M_dataplus)._M_p + sVar3;
  bVar1 = *(byte *)&(src->contents_).data_.rep_.field_0;
  uVar6 = (ulong)(char)bVar1;
  if ((uVar6 & 1) == 0) {
    if (bVar1 != 0) {
      uVar5 = uVar6 >> 1;
      if (bVar1 < 0xf) {
        if (bVar1 < 7) {
          *dst_00 = (src->contents_).data_.rep_.field_0.data[1];
          dst_00[uVar6 >> 2] = (src->contents_).data_.rep_.field_0.data[(uVar6 >> 2) + 1];
          dst_00[uVar5 - 1] = (src->contents_).data_.rep_.field_0.data[uVar5];
        }
        else {
          uVar2 = *(undefined4 *)((long)src + (uVar5 - 3));
          *(undefined4 *)dst_00 = *(undefined4 *)((long)&(src->contents_).data_.rep_.field_0 + 1);
          *(undefined4 *)(dst_00 + (uVar5 - 4)) = uVar2;
        }
      }
      else {
        if (0x1f < bVar1) {
          __assert_fail("n <= 15",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x60,
                        "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                       );
        }
        uVar4 = *(undefined8 *)((long)src + (uVar5 - 7));
        *(undefined8 *)dst_00 =
             *(undefined8 *)((long)&(src->contents_).data_.rep_.field_0.as_tree.cordz_info + 1);
        *(undefined8 *)(dst_00 + (uVar5 - 8)) = uVar4;
      }
    }
    return;
  }
  Cord::CopyToArraySlowPath(src,dst_00);
  return;
}

Assistant:

void AppendCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  const size_t cur_dst_size = dst->size();
  const size_t new_dst_size = cur_dst_size + src.size();
  absl::strings_internal::STLStringResizeUninitializedAmortized(dst,
                                                                new_dst_size);
  char* append_ptr = &(*dst)[cur_dst_size];
  src.CopyToArrayImpl(append_ptr);
}